

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

string * HTTPResponse::date_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  allocator local_d9;
  undefined1 auStack_d8 [8];
  tm tm;
  time_t now;
  char buf [128];
  
  tm.tm_zone = (char *)time((time_t *)0x0);
  ptVar1 = gmtime((time_t *)&tm.tm_zone);
  tm.tm_gmtoff = (long)ptVar1->tm_zone;
  auStack_d8._0_4_ = ptVar1->tm_sec;
  auStack_d8._4_4_ = ptVar1->tm_min;
  tm.tm_sec = ptVar1->tm_hour;
  tm.tm_min = ptVar1->tm_mday;
  tm.tm_hour = ptVar1->tm_mon;
  tm.tm_mday = ptVar1->tm_year;
  tm.tm_mon = ptVar1->tm_wday;
  tm.tm_year = ptVar1->tm_yday;
  tm.tm_wday = ptVar1->tm_isdst;
  tm.tm_yday = *(int *)&ptVar1->field_0x24;
  tm._32_8_ = ptVar1->tm_gmtoff;
  strftime((char *)&now,0x80,"%a, %d %b %Y %H:%M:%S %Z",(tm *)auStack_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,(char *)&now,&local_d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return in_RDI;
}

Assistant:

std::string HTTPResponse::date() {
    char buf[128];
    time_t now = time(0);
    struct tm tm = *gmtime(&now);
    strftime(buf, sizeof(buf), "%a, %d %b %Y %H:%M:%S %Z", &tm);
    return std::string(buf);
}